

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# System.c
# Opt level: O3

char * kwsysSystem_Shell__GetArgument(char *in,char *out,int isUnix,int flags)

{
  byte *pbVar1;
  int iVar2;
  byte *pbVar3;
  uint uVar4;
  size_t __n;
  byte bVar5;
  byte bVar6;
  
  iVar2 = kwsysSystem_Shell__ArgumentNeedsQuotes(in,isUnix,flags);
  bVar5 = (byte)flags;
  if (iVar2 != 0) {
    if ((char)bVar5 < '\0') {
      if (isUnix != 0) {
        *out = '\"';
        out = out + 1;
      }
      *out = '\'';
    }
    else {
      *out = '\"';
    }
    out = out + 1;
  }
  bVar6 = *in;
  if (bVar6 == 0) {
    uVar4 = 0;
  }
  else {
    __n = 0;
    do {
      if (((flags & 0x40U) != 0) &&
         (pbVar3 = (byte *)kwsysSystem_Shell__SkipMakeVariables(in), pbVar3 != (byte *)in)) {
        do {
          bVar6 = *in;
          in = (char *)((byte *)in + 1);
          *out = bVar6;
          out = (char *)((byte *)out + 1);
        } while ((byte *)in != pbVar3);
        bVar6 = *in;
        __n = 0;
        uVar4 = 0;
        if (bVar6 == 0) break;
      }
      if (isUnix == 0) {
        if ((flags & 4U) != 0) goto LAB_00429d05;
        if (bVar6 != 0x5c) {
          if (bVar6 == 0x22) {
            if (0 < (int)__n) {
              memset(out,0x5c,__n);
              out = (char *)((byte *)out + __n);
              __n = 0;
            }
            goto LAB_00429cc0;
          }
          __n = 0;
          goto LAB_00429d09;
        }
        __n = (size_t)((int)__n + 1);
        bVar6 = 0x5c;
LAB_00429d7d:
        *out = bVar6;
LAB_00429d80:
        out = (char *)((byte *)out + 1);
      }
      else {
        if ((bVar6 - 0x22 < 0x3f) &&
           ((0x4400000000000005U >> ((ulong)(bVar6 - 0x22) & 0x3f) & 1) != 0)) {
LAB_00429cc0:
          *out = 0x5c;
          out = (char *)((byte *)out + 1);
LAB_00429d05:
          bVar6 = *in;
        }
LAB_00429d09:
        if (0x24 < bVar6) {
          if (bVar6 == 0x25) {
            *out = 0x25;
            if (((flags & 0x30U) != 0 & bVar5) != 0 || (char)((flags & 2U) >> 1) != '\0') {
              ((byte *)out)[1] = 0x25;
              goto LAB_00429d65;
            }
          }
          else {
            if (bVar6 != 0x3b) goto LAB_00429d7d;
            if ((flags & 2U) != 0) {
              ((byte *)out)[0] = 0x22;
              ((byte *)out)[1] = 0x3b;
LAB_00429da3:
              ((byte *)out)[2] = 0x22;
              out = (char *)((byte *)out + 3);
              goto LAB_00429d83;
            }
            *out = 0x3b;
          }
          goto LAB_00429d80;
        }
        if (bVar6 == 0x23) {
          if ((flags & 9U) != 9) {
            *out = 0x23;
            goto LAB_00429d80;
          }
          ((byte *)out)[0] = 0x24;
          ((byte *)out)[1] = 0x23;
        }
        else {
          if (bVar6 != 0x24) goto LAB_00429d7d;
          if ((flags & 1U) == 0) {
            if ((flags & 2U) != 0) {
              ((byte *)out)[0] = 0x22;
              ((byte *)out)[1] = 0x24;
              goto LAB_00429da3;
            }
            *out = 0x24;
            goto LAB_00429d80;
          }
          ((byte *)out)[0] = 0x24;
          ((byte *)out)[1] = 0x24;
        }
LAB_00429d65:
        out = (char *)((byte *)out + 2);
      }
LAB_00429d83:
      uVar4 = (uint)__n;
      bVar6 = ((byte *)in)[1];
      in = (char *)((byte *)in + 1);
    } while (bVar6 != 0);
  }
  pbVar3 = (byte *)out;
  if (iVar2 != 0) {
    if (0 < (int)uVar4) {
      memset(out,0x5c,(ulong)uVar4);
      out = (char *)((byte *)out + uVar4);
    }
    pbVar1 = (byte *)out + 1;
    pbVar3 = pbVar1;
    if ((char)bVar5 < '\0') {
      *out = 0x27;
      if (isUnix == 0) goto LAB_00429df5;
      pbVar3 = (byte *)out + 2;
      out = (char *)pbVar1;
    }
    *out = 0x22;
  }
LAB_00429df5:
  *pbVar3 = 0;
  return (char *)pbVar3;
}

Assistant:

static char* kwsysSystem_Shell__GetArgument(const char* in, char* out,
                                            int isUnix, int flags)
{
  /* String iterator.  */
  const char* c;

  /* Keep track of how many backslashes have been encountered in a row.  */
  int windows_backslashes = 0;

  /* Whether the argument must be quoted.  */
  int needQuotes = kwsysSystem_Shell__ArgumentNeedsQuotes(in, isUnix, flags);
  if(needQuotes)
    {
    /* Add the opening quote for this argument.  */
    if(flags & kwsysSystem_Shell_Flag_WatcomQuote)
      {
      if(isUnix)
        {
        *out++ = '"';
        }
      *out++ = '\'';
      }
    else
      {
      *out++ = '"';
      }
    }

  /* Scan the string for characters that require escaping or quoting.  */
  for(c=in; *c; ++c)
    {
    /* Look for $(MAKEVAR) syntax if requested.  */
    if(flags & kwsysSystem_Shell_Flag_AllowMakeVariables)
      {
      const char* skip = kwsysSystem_Shell__SkipMakeVariables(c);
      if(skip != c)
        {
        /* Copy to the end of the make variable references.  */
        while(c != skip)
          {
          *out++ = *c++;
          }

        /* The make variable reference eliminates any escaping needed
           for preceding backslashes.  */
        windows_backslashes = 0;

        /* Stop if we have reached the end of the string.  */
        if(!*c)
          {
          break;
          }
        }
      }

    /* Check whether this character needs escaping for the shell.  */
    if(isUnix)
      {
      /* On Unix a few special characters need escaping even inside a
         quoted argument.  */
      if(*c == '\\' || *c == '"' || *c == '`' || *c == '$')
        {
        /* This character needs a backslash to escape it.  */
        *out++ = '\\';
        }
      }
    else if(flags & kwsysSystem_Shell_Flag_EchoWindows)
      {
      /* On Windows the built-in command shell echo never needs escaping.  */
      }
    else
      {
      /* On Windows only backslashes and double-quotes need escaping.  */
      if(*c == '\\')
        {
        /* Found a backslash.  It may need to be escaped later.  */
        ++windows_backslashes;
        }
      else if(*c == '"')
        {
        /* Found a double-quote.  Escape all immediately preceding
           backslashes.  */
        while(windows_backslashes > 0)
          {
          --windows_backslashes;
          *out++ = '\\';
          }

        /* Add the backslash to escape the double-quote.  */
        *out++ = '\\';
        }
      else
        {
        /* We encountered a normal character.  This eliminates any
           escaping needed for preceding backslashes.  */
        windows_backslashes = 0;
        }
      }

    /* Check whether this character needs escaping for a make tool.  */
    if(*c == '$')
      {
      if(flags & kwsysSystem_Shell_Flag_Make)
        {
        /* In Makefiles a dollar is written $$.  The make tool will
           replace it with just $ before passing it to the shell.  */
        *out++ = '$';
        *out++ = '$';
        }
      else if(flags & kwsysSystem_Shell_Flag_VSIDE)
        {
        /* In a VS IDE a dollar is written "$".  If this is written in
           an un-quoted argument it starts a quoted segment, inserts
           the $ and ends the segment.  If it is written in a quoted
           argument it ends quoting, inserts the $ and restarts
           quoting.  Either way the $ is isolated from surrounding
           text to avoid looking like a variable reference.  */
        *out++ = '"';
        *out++ = '$';
        *out++ = '"';
        }
      else
        {
        /* Otherwise a dollar is written just $. */
        *out++ = '$';
        }
      }
    else if(*c == '#')
      {
      if((flags & kwsysSystem_Shell_Flag_Make) &&
         (flags & kwsysSystem_Shell_Flag_WatcomWMake))
        {
        /* In Watcom WMake makefiles a pound is written $#.  The make
           tool will replace it with just # before passing it to the
           shell.  */
        *out++ = '$';
        *out++ = '#';
        }
      else
        {
        /* Otherwise a pound is written just #. */
        *out++ = '#';
        }
      }
    else if(*c == '%')
      {
      if((flags & kwsysSystem_Shell_Flag_VSIDE) ||
         ((flags & kwsysSystem_Shell_Flag_Make) &&
          ((flags & kwsysSystem_Shell_Flag_MinGWMake) ||
           (flags & kwsysSystem_Shell_Flag_NMake))))
        {
        /* In the VS IDE, NMake, or MinGW make a percent is written %%.  */
        *out++ = '%';
        *out++ = '%';
        }
      else
        {
        /* Otherwise a percent is written just %. */
        *out++ = '%';
        }
      }
    else if(*c == ';')
      {
      if(flags & kwsysSystem_Shell_Flag_VSIDE)
        {
        /* In a VS IDE a semicolon is written ";".  If this is written
           in an un-quoted argument it starts a quoted segment,
           inserts the ; and ends the segment.  If it is written in a
           quoted argument it ends quoting, inserts the ; and restarts
           quoting.  Either way the ; is isolated.  */
        *out++ = '"';
        *out++ = ';';
        *out++ = '"';
        }
      else
        {
        /* Otherwise a semicolon is written just ;. */
        *out++ = ';';
        }
      }
    else
      {
      /* Store this character.  */
      *out++ = *c;
      }
    }

  if(needQuotes)
    {
    /* Add enough backslashes to escape any trailing ones.  */
    while(windows_backslashes > 0)
      {
      --windows_backslashes;
      *out++ = '\\';
      }

    /* Add the closing quote for this argument.  */
    if(flags & kwsysSystem_Shell_Flag_WatcomQuote)
      {
      *out++ = '\'';
      if(isUnix)
        {
        *out++ = '"';
        }
      }
    else
      {
      *out++ = '"';
      }
    }

  /* Store a terminating null without incrementing.  */
  *out = 0;

  return out;
}